

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFunctionalTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::BufferTests::init(BufferTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  BufferTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferWriteTests::BufferWriteTests
            ((BufferWriteTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferMapTests::BufferMapTests((BufferMapTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferCopyTests::BufferCopyTests((BufferCopyTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new BufferWriteTests	(m_context));
		addChild(new BufferMapTests		(m_context));
		addChild(new BufferCopyTests	(m_context));
	}